

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O1

JL_STATUS JlSetObjectNumberF64(JlDataObject *NumberObject,double NumberF64)

{
  JL_STATUS JVar1;
  
  if (NumberObject != (JlDataObject *)0x0) {
    JVar1 = JL_STATUS_WRONG_TYPE;
    if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
      (NumberObject->field_2).Number.Type = JL_NUM_TYPE_FLOAT;
      (NumberObject->field_2).Number.field_1.f64 = NumberF64;
      JVar1 = JL_STATUS_SUCCESS;
    }
    return JVar1;
  }
  return JL_STATUS_INVALID_PARAMETER;
}

Assistant:

JL_STATUS
    JlSetObjectNumberF64
    (
        JlDataObject*   NumberObject,
        double          NumberF64
    )
{
    JL_STATUS jlStatus;

    if( NULL != NumberObject )
    {
        if( JL_DATA_TYPE_NUMBER == NumberObject->Type )
        {
            NumberObject->Number.Type = JL_NUM_TYPE_FLOAT;
            NumberObject->Number.f64 = NumberF64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}